

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O0

Status __thiscall
leveldb::log::LogTest::StringSource::Read(StringSource *this,size_t n,Slice *result,char *scratch)

{
  bool bVar1;
  Message *message;
  char *pcVar2;
  Slice *pSVar3;
  char *in_R9;
  Slice local_a8;
  Slice local_98;
  Slice local_88;
  string local_78;
  AssertHelper local_58;
  Message local_50;
  bool local_41;
  undefined1 local_40 [8];
  AssertionResult gtest_ar_;
  char *scratch_local;
  Slice *result_local;
  size_t n_local;
  StringSource *this_local;
  
  local_41 = (bool)((*(byte *)(n + 0x19) ^ 0xff) & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_40,&local_41,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(&local_50);
    message = testing::Message::operator<<
                        (&local_50,(char (*) [32])"must not Read() after eof/error");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(internal *)local_40,(AssertionResult *)"!returned_partial_","false","true"
               ,in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/log_test.cc"
               ,0xb4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,message);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    testing::Message::~Message(&local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  if ((*(byte *)(n + 0x18) & 1) == 0) {
    pSVar3 = (Slice *)Slice::size((Slice *)(n + 8));
    result_local = result;
    if (pSVar3 < result) {
      result_local = (Slice *)Slice::size((Slice *)(n + 8));
      *(undefined1 *)(n + 0x19) = 1;
    }
    pcVar2 = Slice::data((Slice *)(n + 8));
    Slice::Slice(&local_a8,pcVar2,(size_t)result_local);
    *(char **)scratch = local_a8.data_;
    *(size_t *)(scratch + 8) = local_a8.size_;
    Slice::remove_prefix((Slice *)(n + 8),(size_t)result_local);
    Status::OK();
  }
  else {
    *(undefined1 *)(n + 0x18) = 0;
    *(undefined1 *)(n + 0x19) = 1;
    Slice::Slice(&local_88,"read error");
    Slice::Slice(&local_98);
    Status::Corruption((Status *)this,&local_88,&local_98);
  }
  return (Status)(char *)this;
}

Assistant:

Status Read(size_t n, Slice* result, char* scratch) override {
      EXPECT_TRUE(!returned_partial_) << "must not Read() after eof/error";

      if (force_error_) {
        force_error_ = false;
        returned_partial_ = true;
        return Status::Corruption("read error");
      }

      if (contents_.size() < n) {
        n = contents_.size();
        returned_partial_ = true;
      }
      *result = Slice(contents_.data(), n);
      contents_.remove_prefix(n);
      return Status::OK();
    }